

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Tokeniser.h
# Opt level: O0

string * __thiscall
soul::TokenType::getDescription_abi_cxx11_(string *__return_storage_ptr__,TokenType *this)

{
  char *pcVar1;
  allocator<char> local_51;
  string local_50;
  byte local_1a;
  allocator<char> local_19;
  TokenType *local_18;
  TokenType *this_local;
  
  local_1a = 0;
  local_18 = this;
  this_local = (TokenType *)__return_storage_ptr__;
  if (*this->text == '$') {
    pcVar1 = this->text;
    std::allocator<char>::allocator();
    local_1a = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,pcVar1 + 1,&local_19);
  }
  else {
    pcVar1 = this->text;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar1,&local_51);
    choc::text::addDoubleQuotes(__return_storage_ptr__,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  if ((local_1a & 1) != 0) {
    std::allocator<char>::~allocator(&local_19);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getDescription() const
    {
        return text[0] == '$' ? std::string (text + 1)
                              : choc::text::addDoubleQuotes (text);
    }